

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cpp
# Opt level: O3

void __thiscall duckdb::Iterator::PopNode(Iterator *this)

{
  byte bVar1;
  _Elt_pointer pIVar2;
  IndexPointer ptr_p;
  Prefix prefix;
  Prefix local_38;
  
  pIVar2 = (this->nodes).c.
           super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pIVar2 == (this->nodes).c.
                super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
    ptr_p.data = (this->nodes).c.
                 super__Deque_base<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1][0x1f].node.super_IndexPointer.
                 data;
  }
  else {
    ptr_p.data = pIVar2[-1].node.super_IndexPointer.data;
  }
  if ((ptr_p.data & 0x7f00000000000000) == 0x100000000000000) {
    Prefix::Prefix(&local_38,this->art,(Node)ptr_p.data,false,false);
    bVar1 = local_38.data[this->art->prefix_count];
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
               (long)(this->current_key).key_bytes.
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               ((long)(this->current_key).key_bytes.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start + (ulong)bVar1));
    if (this->status == GATE_SET) {
      this->nested_depth = this->nested_depth - bVar1;
    }
  }
  else {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
               (size_type)
               ((this->current_key).key_bytes.
                super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish +
               ~(ulong)(this->current_key).key_bytes.
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start));
    if (this->status == GATE_SET) {
      this->nested_depth = this->nested_depth + 0xff;
    }
  }
  ::std::deque<duckdb::IteratorEntry,_std::allocator<duckdb::IteratorEntry>_>::pop_back
            (&(this->nodes).c);
  if ((long)ptr_p.data < 0) {
    this->status = GATE_NOT_SET;
  }
  return;
}

Assistant:

void Iterator::PopNode() {
	auto gate_status = nodes.top().node.GetGateStatus();

	// Pop the byte and the node.
	if (nodes.top().node.GetType() != NType::PREFIX) {
		current_key.Pop(1);
		if (status == GateStatus::GATE_SET) {
			nested_depth--;
			D_ASSERT(nested_depth < Prefix::ROW_ID_SIZE);
		}

	} else {
		// Pop all prefix bytes and the node.
		Prefix prefix(art, nodes.top().node);
		auto prefix_byte_count = prefix.data[Prefix::Count(art)];
		current_key.Pop(prefix_byte_count);

		if (status == GateStatus::GATE_SET) {
			nested_depth -= prefix_byte_count;
			D_ASSERT(nested_depth < Prefix::ROW_ID_SIZE);
		}
	}
	nodes.pop();

	// We are popping a gate node.
	if (gate_status == GateStatus::GATE_SET) {
		D_ASSERT(status == GateStatus::GATE_SET);
		status = GateStatus::GATE_NOT_SET;
	}
}